

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_reader.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char *infile;
  undefined1 local_a8 [8];
  string str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  properties_type cpp_properties;
  
  if (argc == 1) {
    infile = "full.properties";
  }
  else {
    infile = argv[1];
  }
  read_from_file_abi_cxx11_((string *)local_a8,infile);
  p.second.field_2._8_8_ = 0;
  bVar1 = tokenize_and_parse<properties_actor_traits,properties_actor<properties_actor_traits>,cpp_properties::properties_action<properties_actor<properties_actor_traits>>>
                    ((char *)local_a8,str._M_dataplus._M_p + (long)local_a8,
                     (properties_type *)((long)&p.second.field_2 + 8));
  if (bVar1) {
    this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(str.field_2._M_local_buf + 8);
    for (uVar3 = p.second.field_2._8_8_;
        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)uVar3 !=
        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0; uVar3 = uVar3 + 0x40) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair(this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)uVar3);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)this);
      poVar2 = std::operator<<(poVar2,'=');
      poVar2 = std::operator<<(poVar2,(string *)(p.first.field_2._M_local_buf + 8));
      std::operator<<(poVar2,"\n");
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(this);
    }
  }
  else {
    str.field_2._8_8_ = &p.first._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&str.field_2 + 8),local_a8,str._M_dataplus._M_p + (long)local_a8);
    poVar2 = std::operator<<((ostream *)&std::cout,"Lexical analysis failed\n");
    poVar2 = std::operator<<(poVar2,"stopped at: \"");
    poVar2 = std::operator<<(poVar2,(string *)(str.field_2._M_local_buf + 8));
    std::operator<<(poVar2,"\"\n");
    std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&p.second.field_2 + 8));
  std::__cxx11::string::~string((string *)local_a8);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    // read input from the given file
    std::string str(read_from_file(1 == argc ? "full.properties" : argv[1]));

    // tokenize the given string, the bound functor gets invoked for each of
    // the matched tokens
    char const* first = str.c_str();
    char const* last = &first[str.size()];

    properties_actor_traits::properties_type cpp_properties;

    bool success = tokenize_and_parse<properties_actor_traits>(first, last, cpp_properties);

    // print results
    if (success) {
        for (auto p : cpp_properties) {
            std::cout << p.first << '=' << p.second << "\n";
        }
    } else {
        std::string rest(first, last);
        std::cout << "Lexical analysis failed\n"
            << "stopped at: \"" << rest << "\"\n";
    }
    return 0;
}